

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimePrint(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  float fVar5;
  float fVar6;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    printf("There is no timing manager\n");
  }
  else {
    printf("Default arrival = %8f\n",(double)(pNtk->pManTime->tArrDef).Fall);
    printf("Default required = %8f\n",(double)(pNtk->pManTime->tReqDef).Fall);
    uVar1 = Abc_NtkCiNum(pNtk);
    printf("Inputs (%d):\n",(ulong)uVar1);
    for (local_1c = 0; iVar2 = Abc_NtkCiNum(pNtk), local_1c < iVar2; local_1c = local_1c + 1) {
      pAVar3 = Abc_NtkCi(pNtk,local_1c);
      pcVar4 = Abc_ObjName(pAVar3);
      fVar5 = Abc_NodeReadArrivalWorst(pAVar3);
      fVar6 = Abc_NodeReadRequiredWorst(pAVar3);
      printf("%20s   arrival = %8f   required = %8f\n",(double)fVar5,(double)fVar6,pcVar4);
    }
    uVar1 = Abc_NtkCoNum(pNtk);
    printf("Outputs (%d):\n",(ulong)uVar1);
    for (local_1c = 0; iVar2 = Abc_NtkCoNum(pNtk), local_1c < iVar2; local_1c = local_1c + 1) {
      pAVar3 = Abc_NtkCo(pNtk,local_1c);
      pcVar4 = Abc_ObjName(pAVar3);
      fVar5 = Abc_NodeReadArrivalWorst(pAVar3);
      fVar6 = Abc_NodeReadRequiredWorst(pAVar3);
      printf("%20s   arrival = %8f   required = %8f\n",(double)fVar5,(double)fVar6,pcVar4);
    }
  }
  return;
}

Assistant:

void Abc_NtkTimePrint( Abc_Ntk_t * pNtk )
{
    if ( pNtk->pManTime == NULL )
        printf( "There is no timing manager\n" );
    else
    {
        Abc_Obj_t * pObj; int i;
        printf( "Default arrival = %8f\n", pNtk->pManTime->tArrDef.Fall );
        printf( "Default required = %8f\n", pNtk->pManTime->tReqDef.Fall );
        printf( "Inputs (%d):\n", Abc_NtkCiNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            printf( "%20s   arrival = %8f   required = %8f\n", 
                Abc_ObjName(pObj), 
                Abc_NodeReadArrivalWorst(pObj), 
                Abc_NodeReadRequiredWorst(pObj) );
        printf( "Outputs (%d):\n", Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            printf( "%20s   arrival = %8f   required = %8f\n", 
                Abc_ObjName(pObj), 
                Abc_NodeReadArrivalWorst(pObj), 
                Abc_NodeReadRequiredWorst(pObj) );
    }
}